

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Func::Dump(Func *this,IRDumpFlags flags)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  Instr **ppIVar5;
  
  DumpHeader(this);
  ppIVar5 = &this->m_headInstr;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pIVar4 = (Instr *)0x0;
  do {
    this_00 = *ppIVar5;
    if (this_00 == (Instr *)0x0) {
      Output::Flush();
      return;
    }
    if ((pIVar4 != (Instr *)0x0) && (pIVar4->m_next != this_00)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x885,"(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)"
                         ,"Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    IR::Instr::DumpGlobOptInstrString(this_00);
    (**this_00->_vptr_Instr)(this_00,flags);
    ppIVar5 = &this_00->m_next;
    pIVar4 = this_00;
  } while( true );
}

Assistant:

void
Func::Dump(IRDumpFlags flags)
{
    this->DumpHeader();

    FOREACH_INSTR_IN_FUNC(instr, this)
    {
        instr->DumpGlobOptInstrString();
        instr->Dump(flags);
    }NEXT_INSTR_IN_FUNC;

    Output::Flush();
}